

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_base64.cpp
# Opt level: O0

base64 * __thiscall Omega_h::base64::read_encoded_abi_cxx11_(base64 *this,istream *f)

{
  int iVar1;
  uchar val;
  int c;
  istream *f_local;
  string *out;
  
  std::__cxx11::string::string((string *)this);
  while (((iVar1 = std::istream::get(), -1 < iVar1 && (iVar1 < 0x80)) &&
         ((byte)(anonymous_namespace)::char_to_value[iVar1] < 0x40))) {
    std::__cxx11::string::push_back((char)this);
  }
  return this;
}

Assistant:

std::string read_encoded(std::istream& f) {
  std::string out;
  while (true) {
    int c = f.get();
    if (c < 0 || c > 127) break;
    unsigned char val = char_to_value[c];
    if (val > 63) break;
    out.push_back(static_cast<char>(c));
  }
  return out;
}